

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_common.c
# Opt level: O0

int CP_sendToPeer(SstStream s,CP_PeerCohort Cohort,int Rank,CMFormat Format,void *Data)

{
  int iVar1;
  CMConnection p_Var2;
  char *Format_00;
  undefined8 in_RCX;
  uint in_EDX;
  CP_PeerConnection *in_RSI;
  SstStream in_RDI;
  undefined8 in_R8;
  int i;
  CP_PeerConnection *Peers;
  attr_list in_stack_00000d60;
  CManager in_stack_00000d68;
  int local_3c;
  uint local_4;
  
  if (in_RSI[(int)in_EDX].CMconn == (CMConnection)0x0) {
    p_Var2 = Tunneling_get_conn(in_stack_00000d68,in_stack_00000d60);
    in_RSI[(int)in_EDX].CMconn = p_Var2;
    if (in_RSI[(int)in_EDX].CMconn == (CMConnection)0x0) {
      CP_error(in_RDI,"Connection failed in CP_sendToPeer! Contact list was:\n");
      Format_00 = (char *)attr_list_to_string(in_RSI[(int)in_EDX].ContactList);
      CP_error(in_RDI,Format_00);
      return 0;
    }
    if (in_RDI->Role == ReaderRole) {
      CP_verbose(in_RDI,TraceVerbose,"Registering reader close handler for peer %d CONNECTION %p\n",
                 (ulong)in_EDX,in_RSI[(int)in_EDX].CMconn);
      CMconn_register_close_handler(in_RSI[(int)in_EDX].CMconn,ReaderConnCloseHandler,in_RDI);
    }
    else {
      for (local_3c = 0; local_3c < in_RDI->ReaderCount; local_3c = local_3c + 1) {
        if (in_RSI == in_RDI->Readers[local_3c]->Connections) {
          CP_verbose(in_RDI,TraceVerbose,
                     "Registering writer close handler for peer %d, CONNECTION %p\n",(ulong)in_EDX,
                     in_RSI[(int)in_EDX].CMconn);
          CMconn_register_close_handler
                    (in_RSI[(int)in_EDX].CMconn,WriterConnCloseHandler,in_RDI->Readers[local_3c]);
          break;
        }
      }
    }
  }
  iVar1 = CMwrite(in_RSI[(int)in_EDX].CMconn,in_RCX,in_R8);
  if (iVar1 != 1) {
    CP_verbose(in_RDI,CriticalVerbose,
               "Message failed to send to peer %d CONNECTION %p in CP_sendToPeer()\n",(ulong)in_EDX,
               in_RSI[(int)in_EDX].CMconn);
  }
  local_4 = (uint)(iVar1 == 1);
  return local_4;
}

Assistant:

static int CP_sendToPeer(SstStream s, CP_PeerCohort Cohort, int Rank, CMFormat Format, void *Data)
{
    CP_PeerConnection *Peers = (CP_PeerConnection *)Cohort;
    if (Peers[Rank].CMconn == NULL)
    {
        Peers[Rank].CMconn = Tunneling_get_conn(s->CPInfo->SharedCM->cm, Peers[Rank].ContactList);
        if (!Peers[Rank].CMconn)
        {
            CP_error(s, "Connection failed in CP_sendToPeer! Contact list was:\n");
            CP_error(s, attr_list_to_string(Peers[Rank].ContactList));
            return 0;
        }
        if (s->Role == ReaderRole)
        {
            CP_verbose(s, TraceVerbose,
                       "Registering reader close handler for peer %d CONNECTION %p\n", Rank,
                       Peers[Rank].CMconn);
            CMconn_register_close_handler(Peers[Rank].CMconn, ReaderConnCloseHandler, (void *)s);
        }
        else
        {
            for (int i = 0; i < s->ReaderCount; i++)
            {
                if (Peers == s->Readers[i]->Connections)
                {
                    CP_verbose(s, TraceVerbose,
                               "Registering writer close handler for peer %d, "
                               "CONNECTION %p\n",
                               Rank, Peers[Rank].CMconn);
                    CMconn_register_close_handler(Peers[Rank].CMconn, WriterConnCloseHandler,
                                                  (void *)s->Readers[i]);
                    break;
                }
            }
        }
    }
    if (CMwrite(Peers[Rank].CMconn, Format, Data) != 1)
    {
        CP_verbose(s, CriticalVerbose,
                   "Message failed to send to peer %d CONNECTION %p in "
                   "CP_sendToPeer()\n",
                   Rank, Peers[Rank].CMconn);
        return 0;
    }
    return 1;
}